

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_stg.c
# Opt level: O3

int IDASetNonlinearSolverSensStg(void *ida_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  int iVar2;
  long lVar3;
  int error_code;
  char *msgfmt;
  int iVar4;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar4 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar2 = 0x33;
  }
  else if (NLS == (SUNNonlinearSolver)0x0) {
    msgfmt = "NLS must be non-NULL";
    iVar4 = -0x16;
    ida_mem = (IDAMem)0x0;
    error_code = -0x16;
    iVar2 = 0x3b;
  }
  else {
    p_Var1 = NLS->ops;
    if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
        (p_Var1->solve ==
         (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0))
       || (p_Var1->setsysfn == (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
      msgfmt = "NLS does not support required operations";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar2 = 0x44;
    }
    else {
      iVar2 = SUNNonlinSolGetType(NLS);
      if (iVar2 == 0) {
        if (*(int *)((long)ida_mem + 0x9c) == 0) {
          msgfmt = "Illegal attempt to call before calling IDASensInit.";
          iVar4 = -0x16;
          error_code = -0x16;
          iVar2 = 0x54;
        }
        else if (*(int *)((long)ida_mem + 0xa4) == 2) {
          if ((*(long *)((long)ida_mem + 0x6e8) != 0) && (*(int *)((long)ida_mem + 0x6f0) != 0)) {
            SUNNonlinSolFree();
          }
          *(SUNNonlinearSolver *)((long)ida_mem + 0x6e8) = NLS;
          *(undefined4 *)((long)ida_mem + 0x6f0) = 0;
          iVar2 = SUNNonlinSolSetSysFn(NLS,idaNlsResidualSensStg);
          if (iVar2 == 0) {
            iVar2 = SUNNonlinSolSetConvTestFn
                              (*(undefined8 *)((long)ida_mem + 0x6e8),idaNlsConvTestSensStg,ida_mem)
            ;
            if (iVar2 == 0) {
              iVar2 = SUNNonlinSolSetMaxIters(*(undefined8 *)((long)ida_mem + 0x6e8),4);
              if (iVar2 == 0) {
                if (*(int *)((long)ida_mem + 0x72c) != 0) {
LAB_00129117:
                  iVar2 = *(int *)((long)ida_mem + 0xa0);
                  if ((long)iVar2 < 1) {
                    return 0;
                  }
                  lVar3 = 0;
                  do {
                    *(undefined8 *)(*(long *)**(undefined8 **)((long)ida_mem + 0x710) + lVar3 * 8) =
                         *(undefined8 *)(*(long *)((long)ida_mem + 0x3a0) + lVar3 * 8);
                    *(undefined8 *)(*(long *)**(undefined8 **)((long)ida_mem + 0x718) + lVar3 * 8) =
                         *(undefined8 *)(*(long *)((long)ida_mem + 0x388) + lVar3 * 8);
                    *(undefined8 *)(*(long *)**(undefined8 **)((long)ida_mem + 0x720) + lVar3 * 8) =
                         *(undefined8 *)(*(long *)((long)ida_mem + 0x380) + lVar3 * 8);
                    lVar3 = lVar3 + 1;
                  } while (iVar2 != lVar3);
                  return 0;
                }
                lVar3 = N_VNewEmpty_SensWrapper(*(undefined4 *)((long)ida_mem + 0xa0),*ida_mem);
                *(long *)((long)ida_mem + 0x710) = lVar3;
                if (lVar3 == 0) {
                  msgfmt = "A memory request failed.";
                  iVar4 = -0x15;
                  error_code = -0x15;
                  iVar2 = 0x91;
                }
                else {
                  lVar3 = N_VNewEmpty_SensWrapper(*(undefined4 *)((long)ida_mem + 0xa0),*ida_mem);
                  *(long *)((long)ida_mem + 0x718) = lVar3;
                  if (lVar3 == 0) {
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x710));
                    msgfmt = "A memory request failed.";
                    iVar4 = -0x15;
                    error_code = -0x15;
                    iVar2 = 0x9b;
                  }
                  else {
                    lVar3 = N_VNewEmpty_SensWrapper(*(undefined4 *)((long)ida_mem + 0xa0),*ida_mem);
                    *(long *)((long)ida_mem + 0x720) = lVar3;
                    if (lVar3 != 0) {
                      *(undefined4 *)((long)ida_mem + 0x72c) = 1;
                      goto LAB_00129117;
                    }
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x710));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x718));
                    msgfmt = "A memory request failed.";
                    iVar4 = -0x15;
                    error_code = -0x15;
                    iVar2 = 0xa6;
                  }
                }
              }
              else {
                msgfmt = "Setting maximum number of nonlinear iterations failed";
                iVar4 = -0x16;
                error_code = -0x16;
                iVar2 = 0x85;
              }
            }
            else {
              msgfmt = "Setting convergence test function failed";
              iVar4 = -0x16;
              error_code = -0x16;
              iVar2 = 0x7c;
            }
          }
          else {
            msgfmt = "Setting nonlinear system function failed";
            iVar4 = -0x16;
            error_code = -0x16;
            iVar2 = 0x72;
          }
        }
        else {
          msgfmt = "Sensitivity solution method is not IDA_STAGGERED";
          iVar4 = -0x16;
          error_code = -0x16;
          iVar2 = 0x5c;
        }
      }
      else {
        msgfmt = "NLS type must be SUNNONLINEARSOLVER_ROOTFIND";
        iVar4 = -0x16;
        error_code = -0x16;
        iVar2 = 0x4c;
      }
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDASetNonlinearSolverSensStg",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDASetNonlinearSolverSensStg(void* ida_mem, SUNNonlinearSolver NLS)
{
  IDAMem IDA_mem;
  int retval, is;

  /* return immediately if IDA memory is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS must be non-NULL");
    return (IDA_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (IDA_ILL_INPUT);
  }

  /* check for allowed nonlinear solver types */
  if (SUNNonlinSolGetType(NLS) != SUNNONLINEARSOLVER_ROOTFIND)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
    return (IDA_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(IDA_mem->ida_sensi))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_ILL_INPUT);
  }

  /* check that the staggered corrector was selected */
  if (IDA_mem->ida_ism != IDA_STAGGERED)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Sensitivity solution method is not IDA_STAGGERED");
    return (IDA_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((IDA_mem->NLSstg != NULL) && (IDA_mem->ownNLSstg))
  {
    retval = SUNNonlinSolFree(IDA_mem->NLSstg);
  }

  /* set SUNNonlinearSolver pointer */
  IDA_mem->NLSstg = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, IDA will set the flag to SUNTRUE after this function returns. */
  IDA_mem->ownNLSstg = SUNFALSE;

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(IDA_mem->NLSstg, idaNlsResidualSensStg);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (IDA_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(IDA_mem->NLSstg, idaNlsConvTestSensStg,
                                     ida_mem);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (IDA_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(IDA_mem->NLSstg, MAXIT);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (IDA_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (IDA_mem->stgMallocDone == SUNFALSE)
  {
    IDA_mem->ypredictStg = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns,
                                                   IDA_mem->ida_sunctx);
    if (IDA_mem->ypredictStg == NULL)
    {
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ycorStg = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns,
                                               IDA_mem->ida_sunctx);
    if (IDA_mem->ycorStg == NULL)
    {
      N_VDestroy(IDA_mem->ypredictStg);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ewtStg = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns,
                                              IDA_mem->ida_sunctx);
    if (IDA_mem->ewtStg == NULL)
    {
      N_VDestroy(IDA_mem->ypredictStg);
      N_VDestroy(IDA_mem->ycorStg);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->stgMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    NV_VEC_SW(IDA_mem->ypredictStg, is) = IDA_mem->ida_yySpredict[is];
    NV_VEC_SW(IDA_mem->ycorStg, is)     = IDA_mem->ida_eeS[is];
    NV_VEC_SW(IDA_mem->ewtStg, is)      = IDA_mem->ida_ewtS[is];
  }

  return (IDA_SUCCESS);
}